

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

void __thiscall mario::TimerQueue::TimerQueue(TimerQueue *this,EventLoop *loop)

{
  _Rb_tree_header *p_Var1;
  int fdArg;
  function<void_(mario::Timestamp)> fStack_58;
  _Bind<void_(mario::TimerQueue::*(mario::TimerQueue_*))()> local_38;
  
  this->_loop = loop;
  fdArg = detail::createTimerfd();
  this->_timerfd = fdArg;
  Channel::Channel(&this->_timerfdChannel,loop,fdArg);
  p_Var1 = &(this->_timers)._M_t._M_impl.super__Rb_tree_header;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(this->_timers)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_callingExpiredTimers = false;
  p_Var1 = &(this->_activeTimers)._M_t._M_impl.super__Rb_tree_header;
  (this->_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header;
  (this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38._M_f = (offset_in_TimerQueue_to_subr)handleRead;
  local_38._8_8_ = 0;
  local_38._M_bound_args.super__Tuple_impl<0UL,_mario::TimerQueue_*>.
  super__Head_base<0UL,_mario::TimerQueue_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mario::TimerQueue_*>)(_Tuple_impl<0UL,_mario::TimerQueue_*>)this;
  std::function<void(mario::Timestamp)>::
  function<std::_Bind<void(mario::TimerQueue::*(mario::TimerQueue*))()>,void>
            ((function<void(mario::Timestamp)> *)&fStack_58,&local_38);
  std::function<void_(mario::Timestamp)>::operator=
            (&(this->_timerfdChannel)._readCallback,&fStack_58);
  std::_Function_base::~_Function_base(&fStack_58.super__Function_base);
  Channel::enableReading(&this->_timerfdChannel);
  return;
}

Assistant:

TimerQueue::TimerQueue(EventLoop* loop)
    : _loop(loop)
    , _timerfd(createTimerfd()) 
    , _timerfdChannel(loop, _timerfd)
    , _timers()
    , _callingExpiredTimers(false)
{
    _timerfdChannel.setReadCallback(
            std::bind(&TimerQueue::handleRead, this)
        );
    _timerfdChannel.enableReading();
}